

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFieldInfo
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  pointer *ppbVar1;
  long lVar2;
  once_flag *__once;
  Printer *pPVar3;
  ulong uVar4;
  bool bVar5;
  long *plVar6;
  ulong uVar7;
  undefined8 *puVar8;
  Descriptor *pDVar9;
  size_type *psVar10;
  Descriptor *pDVar11;
  pointer pbVar12;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *pFVar13;
  FieldDescriptor *field;
  long lVar14;
  ulong uVar15;
  long lVar16;
  OneofDescriptor *pOVar17;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  Printer *local_108;
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  GeneratorOptions *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  numbers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oneof_entries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oneof_fields;
  
  local_e0 = options;
  bVar5 = anon_unknown_0::HasRepeatedFields((GeneratorOptions *)desc,(Descriptor *)options);
  local_108 = printer;
  if (bVar5) {
    pDVar9 = desc;
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_88,(_anonymous_namespace_ *)(local_e0->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(local_e0->namespace_prefix)._M_string_length,desc);
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (0 < *(int *)(desc + 0x68)) {
      lVar16 = 0;
      lVar14 = 0;
      pFVar13 = extraout_RDX;
      do {
        lVar2 = *(long *)(desc + 0x28);
        if (*(int *)(lVar2 + 0x3c + lVar16) == 3) {
          __once = *(once_flag **)(lVar2 + 0x30 + lVar16);
          if (__once != (once_flag *)0x0) {
            local_128._0_8_ = FieldDescriptor::TypeOnceInit;
            local_100._0_8_ = (FieldDescriptor *)(lVar2 + lVar16);
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (__once,(_func_void_FieldDescriptor_ptr **)local_128,
                       (FieldDescriptor **)local_100);
            pFVar13 = extraout_RDX_00;
          }
          if ((*(int *)(lVar2 + 0x38 + lVar16) != 0xb) ||
             (bVar5 = FieldDescriptor::is_map_message_type((FieldDescriptor *)(lVar2 + lVar16)),
             pFVar13 = extraout_RDX_01, !bVar5)) {
            (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                      ((string *)local_128,
                       (_anonymous_namespace_ *)(*(long *)(desc + 0x28) + lVar16),pFVar13);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&numbers
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_128);
            pFVar13 = extraout_RDX_02;
            if ((Descriptor *)local_128._0_8_ != (Descriptor *)(local_128 + 0x10)) {
              operator_delete((void *)local_128._0_8_);
              pFVar13 = extraout_RDX_03;
            }
          }
        }
        lVar14 = lVar14 + 1;
        lVar16 = lVar16 + 0x98;
      } while (lVar14 < *(int *)(desc + 0x68));
    }
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_100,(protobuf *)&numbers,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x3a3a50,(char *)pDVar9);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x3e9ca6);
    pPVar3 = local_108;
    pDVar9 = (Descriptor *)(plVar6 + 2);
    if ((Descriptor *)*plVar6 == pDVar9) {
      local_118._M_allocated_capacity = *(undefined8 *)pDVar9;
      local_118._8_8_ = plVar6[3];
      local_128._0_8_ = (Descriptor *)(local_128 + 0x10);
    }
    else {
      local_118._M_allocated_capacity = *(undefined8 *)pDVar9;
      local_128._0_8_ = (Descriptor *)*plVar6;
    }
    local_128._8_8_ = plVar6[1];
    *plVar6 = (long)pDVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append(local_128);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_a8.field_2._M_allocated_capacity = *psVar10;
      local_a8.field_2._8_8_ = plVar6[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar10;
      local_a8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_a8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((Descriptor *)local_128._0_8_ != (Descriptor *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_);
    }
    if ((FieldDescriptor *)local_100._0_8_ != (FieldDescriptor *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&numbers);
    io::Printer::
    Print<char[10],std::__cxx11::string,char[14],char_const*,char[10],std::__cxx11::string>
              (pPVar3,
               "/**\n * List of repeated fields within this message type.\n * @private {!Array<number>}\n * @const\n */\n$classname$$rptfieldarray$ = $rptfields$;\n\n"
               ,(char (*) [10])0x3a8a6c,&local_88,(char (*) [14])"rptfieldarray",
               &(anonymous_namespace)::kRepeatedFieldArrayName,(char (*) [10])"rptfields",&local_a8)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  uVar7 = (ulong)*(int *)(desc + 0x68);
  if (0 < (long)uVar7) {
    if (*(long *)(*(long *)(desc + 0x28) + 0x58) == 0) {
      plVar6 = (long *)(*(long *)(desc + 0x28) + 0xf0);
      uVar4 = 1;
      do {
        uVar15 = uVar4;
        if (uVar7 == uVar15) break;
        lVar14 = *plVar6;
        plVar6 = plVar6 + 0x13;
        uVar4 = uVar15 + 1;
      } while (lVar14 == 0);
      if (uVar7 <= uVar15) {
        return;
      }
    }
    pDVar11 = desc;
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_a8,(_anonymous_namespace_ *)(local_e0->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(local_e0->namespace_prefix)._M_string_length,desc);
    oneof_entries.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    oneof_entries.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    oneof_entries.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pDVar9 = (Descriptor *)(local_128 + 0x10);
    if (0 < *(int *)(desc + 0x6c)) {
      lVar14 = 0;
      do {
        pOVar17 = (OneofDescriptor *)(lVar14 * 0x30 + *(long *)(desc + 0x30));
        bVar5 = anon_unknown_0::IgnoreOneof(pOVar17);
        if (!bVar5) {
          oneof_fields.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          oneof_fields.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          oneof_fields.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (0 < *(int *)(pOVar17 + 0x18)) {
            lVar16 = 0;
            do {
              bVar5 = anon_unknown_0::IgnoreField
                                (*(FieldDescriptor **)(*(long *)(pOVar17 + 0x20) + lVar16 * 8));
              if (!bVar5) {
                (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                          ((string *)local_128,
                           *(_anonymous_namespace_ **)(*(long *)(pOVar17 + 0x20) + lVar16 * 8),field
                          );
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &oneof_fields,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_128);
                if ((Descriptor *)local_128._0_8_ != pDVar9) {
                  operator_delete((void *)local_128._0_8_);
                }
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < *(int *)(pOVar17 + 0x18));
          }
          Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (&local_88,(protobuf *)&oneof_fields,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x3a3a50,(char *)pDVar11);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x3e9ca6);
          pFVar13 = (FieldDescriptor *)(puVar8 + 2);
          if ((FieldDescriptor *)*puVar8 == pFVar13) {
            local_f0._M_allocated_capacity = *(undefined8 *)pFVar13;
            local_f0._8_8_ = puVar8[3];
            local_100._0_8_ = (FieldDescriptor *)(local_100 + 0x10);
          }
          else {
            local_f0._M_allocated_capacity = *(undefined8 *)pFVar13;
            local_100._0_8_ = (FieldDescriptor *)*puVar8;
          }
          local_100._8_8_ = puVar8[1];
          *puVar8 = pFVar13;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append(local_100);
          pDVar11 = (Descriptor *)(puVar8 + 2);
          if ((Descriptor *)*puVar8 == pDVar11) {
            local_118._M_allocated_capacity = *(undefined8 *)pDVar11;
            local_118._8_8_ = puVar8[3];
            local_128._0_8_ = pDVar9;
          }
          else {
            local_118._M_allocated_capacity = *(undefined8 *)pDVar11;
            local_128._0_8_ = (Descriptor *)*puVar8;
          }
          local_128._8_8_ = puVar8[1];
          *puVar8 = pDVar11;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &oneof_entries,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128)
          ;
          if ((Descriptor *)local_128._0_8_ != pDVar9) {
            operator_delete((void *)local_128._0_8_);
          }
          if ((FieldDescriptor *)local_100._0_8_ != (FieldDescriptor *)(local_100 + 0x10)) {
            operator_delete((void *)local_100._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&oneof_fields);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < *(int *)(desc + 0x6c));
    }
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_100,(protobuf *)&oneof_entries,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x3a3a50,(char *)pDVar11);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x3e9ca6);
    pPVar3 = local_108;
    pDVar11 = (Descriptor *)(puVar8 + 2);
    if ((Descriptor *)*puVar8 == pDVar11) {
      local_118._M_allocated_capacity = *(undefined8 *)pDVar11;
      local_118._8_8_ = puVar8[3];
      local_128._0_8_ = pDVar9;
    }
    else {
      local_118._M_allocated_capacity = *(undefined8 *)pDVar11;
      local_128._0_8_ = (Descriptor *)*puVar8;
    }
    local_128._8_8_ = puVar8[1];
    *puVar8 = pDVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append(local_128);
    ppbVar1 = &numbers.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar12 = (pointer)(plVar6 + 2);
    if ((pointer)*plVar6 == pbVar12) {
      numbers.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar12->_M_dataplus)._M_p;
      numbers.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
    }
    else {
      numbers.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar12->_M_dataplus)._M_p;
      numbers.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar6;
    }
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar6[1];
    *plVar6 = (long)pbVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((Descriptor *)local_128._0_8_ != pDVar9) {
      operator_delete((void *)local_128._0_8_);
    }
    if ((FieldDescriptor *)local_100._0_8_ != (FieldDescriptor *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&oneof_entries);
    io::Printer::
    Print<char[10],std::__cxx11::string,char[16],char_const*,char[12],std::__cxx11::string>
              (pPVar3,
               "/**\n * Oneof group definitions for this message. Each group defines the field\n * numbers belonging to that group. When of these fields\' value is set, all\n * other fields in the group are cleared. During deserialization, if multiple\n * fields are encountered for a group, only the last value seen will be kept.\n * @private {!Array<!Array<number>>}\n * @const\n */\n$classname$$oneofgrouparray$ = $oneofgroups$;\n\n"
               ,(char (*) [10])0x3a8a6c,&local_a8,(char (*) [16])"oneofgrouparray",
               &(anonymous_namespace)::kOneofGroupArrayName,(char (*) [12])"oneofgroups",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numbers);
    if (numbers.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
      operator_delete(numbers.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (0 < *(int *)(desc + 0x6c)) {
      lVar14 = 0;
      lVar16 = 0;
      do {
        pOVar17 = (OneofDescriptor *)(*(long *)(desc + 0x30) + lVar14);
        bVar5 = anon_unknown_0::IgnoreOneof(pOVar17);
        if (!bVar5) {
          GenerateOneofCaseDefinition
                    ((Generator *)pOVar17,local_e0,pPVar3,
                     (OneofDescriptor *)(*(long *)(desc + 0x30) + lVar14));
        }
        lVar16 = lVar16 + 1;
        lVar14 = lVar14 + 0x30;
      } while (lVar16 < *(int *)(desc + 0x6c));
    }
  }
  return;
}

Assistant:

void Generator::GenerateClassFieldInfo(const GeneratorOptions& options,
                                       io::Printer* printer,
                                       const Descriptor* desc) const {
  if (HasRepeatedFields(options, desc)) {
    printer->Print(
        "/**\n"
        " * List of repeated fields within this message type.\n"
        " * @private {!Array<number>}\n"
        " * @const\n"
        " */\n"
        "$classname$$rptfieldarray$ = $rptfields$;\n"
        "\n",
        "classname", GetMessagePath(options, desc), "rptfieldarray",
        kRepeatedFieldArrayName, "rptfields",
        RepeatedFieldNumberList(options, desc));
  }

  if (HasOneofFields(desc)) {
    printer->Print(
        "/**\n"
        " * Oneof group definitions for this message. Each group defines the "
        "field\n"
        " * numbers belonging to that group. When of these fields' value is "
        "set, all\n"
        " * other fields in the group are cleared. During deserialization, if "
        "multiple\n"
        " * fields are encountered for a group, only the last value seen will "
        "be kept.\n"
        " * @private {!Array<!Array<number>>}\n"
        " * @const\n"
        " */\n"
        "$classname$$oneofgrouparray$ = $oneofgroups$;\n"
        "\n",
        "classname", GetMessagePath(options, desc), "oneofgrouparray",
        kOneofGroupArrayName, "oneofgroups", OneofGroupList(desc));

    for (int i = 0; i < desc->oneof_decl_count(); i++) {
      if (IgnoreOneof(desc->oneof_decl(i))) {
        continue;
      }
      GenerateOneofCaseDefinition(options, printer, desc->oneof_decl(i));
    }
  }
}